

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O3

void __thiscall SimpleLogger::doCompression(SimpleLogger *this,size_t file_num)

{
  SimpleLogger *pSVar1;
  __int_type _Var2;
  long *plVar3;
  undefined8 *puVar4;
  size_type *psVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  undefined8 this_00;
  SimpleLogger *pSVar7;
  ulong file_num_00;
  string filename_tar;
  string cmd;
  string filename;
  string local_f8;
  undefined1 local_d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  ulong local_78;
  string local_70;
  undefined1 local_50 [32];
  
  getLogFilePath_abi_cxx11_(&local_70,this,file_num);
  local_98._M_allocated_capacity = (size_type)&local_88;
  local_98._8_8_ = 0;
  local_88._M_local_buf[0] = '\0';
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8,
                 "tar zcvf ",&local_70);
  plVar3 = (long *)std::__cxx11::string::append(local_b8._M_local_buf);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_f8.field_2._M_allocated_capacity = *psVar5;
    local_f8.field_2._8_8_ = plVar3[3];
  }
  else {
    local_f8.field_2._M_allocated_capacity = *psVar5;
    local_f8._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_f8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_f8,(ulong)local_70._M_dataplus._M_p);
  pSVar1 = (SimpleLogger *)(local_d8 + 0x10);
  pSVar7 = (SimpleLogger *)(plVar3 + 2);
  if ((SimpleLogger *)*plVar3 == pSVar7) {
    local_d8._16_8_ = (pSVar7->filePath)._M_dataplus._M_p;
    local_d8._24_8_ = plVar3[3];
    local_d8._0_8_ = pSVar1;
  }
  else {
    local_d8._16_8_ = (pSVar7->filePath)._M_dataplus._M_p;
    local_d8._0_8_ = (SimpleLogger *)*plVar3;
  }
  local_d8._8_8_ = plVar3[1];
  *plVar3 = (long)pSVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::operator=((string *)local_98._M_local_buf,(string *)local_d8);
  if ((SimpleLogger *)local_d8._0_8_ != pSVar1) {
    operator_delete((void *)local_d8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  this_00 = local_b8._M_allocated_capacity;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_allocated_capacity != &local_a8) {
    operator_delete((void *)local_b8._M_allocated_capacity);
  }
  execCmd((SimpleLogger *)this_00,(string *)&local_98);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 "rm -f ",&local_70);
  std::__cxx11::string::operator=((string *)local_98._M_local_buf,(string *)local_d8);
  pSVar7 = (SimpleLogger *)local_d8._0_8_;
  if ((SimpleLogger *)local_d8._0_8_ != pSVar1) {
    operator_delete((void *)local_d8._0_8_);
  }
  execCmd(pSVar7,(string *)&local_98);
  _Var2 = (this->maxLogFiles).super___atomic_base<unsigned_long>._M_i;
  if (_Var2 - 1 < file_num) {
    file_num_00 = this->minRevnum;
    local_78 = file_num - _Var2;
    if (file_num_00 <= local_78) {
      do {
        getLogFilePath_abi_cxx11_((string *)local_d8,this,file_num_00);
        std::__cxx11::string::operator=((string *)&local_70,(string *)local_d8);
        if ((SimpleLogger *)local_d8._0_8_ != pSVar1) {
          operator_delete((void *)local_d8._0_8_);
        }
        getLogFilePath_abi_cxx11_(&local_f8,this,file_num_00);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
        pSVar7 = (SimpleLogger *)(plVar3 + 2);
        if ((SimpleLogger *)*plVar3 == pSVar7) {
          local_d8._16_8_ = (pSVar7->filePath)._M_dataplus._M_p;
          local_d8._24_8_ = plVar3[3];
          local_d8._0_8_ = pSVar1;
        }
        else {
          local_d8._16_8_ = (pSVar7->filePath)._M_dataplus._M_p;
          local_d8._0_8_ = (SimpleLogger *)*plVar3;
        }
        local_d8._8_8_ = plVar3[1];
        *plVar3 = (long)pSVar7;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,"rm -f ",&local_70);
        plVar3 = (long *)std::__cxx11::string::append((char *)local_50);
        local_b8._M_allocated_capacity = (size_type)&local_a8;
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 == paVar6) {
          local_a8._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_a8._8_8_ = plVar3[3];
        }
        else {
          local_a8._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_b8._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar3;
        }
        local_b8._8_8_ = plVar3[1];
        *plVar3 = (long)paVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append(local_b8._M_local_buf,local_d8._0_8_)
        ;
        psVar5 = puVar4 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_f8.field_2._M_allocated_capacity = *psVar5;
          local_f8.field_2._8_8_ = puVar4[3];
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        }
        else {
          local_f8.field_2._M_allocated_capacity = *psVar5;
          local_f8._M_dataplus._M_p = (pointer)*puVar4;
        }
        local_f8._M_string_length = puVar4[1];
        *puVar4 = psVar5;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_98._M_local_buf,(string *)&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_allocated_capacity != &local_a8) {
          operator_delete((void *)local_b8._M_allocated_capacity);
        }
        pSVar7 = (SimpleLogger *)local_50._0_8_;
        if ((SimpleLogger *)local_50._0_8_ != (SimpleLogger *)(local_50 + 0x10)) {
          operator_delete((void *)local_50._0_8_);
        }
        execCmd(pSVar7,(string *)&local_98);
        file_num_00 = file_num_00 + 1;
        this->minRevnum = file_num_00;
        if ((SimpleLogger *)local_d8._0_8_ != pSVar1) {
          operator_delete((void *)local_d8._0_8_);
        }
      } while (file_num_00 <= local_78);
    }
  }
  LOCK();
  (this->numCompJobs).super___atomic_base<unsigned_int>._M_i =
       (this->numCompJobs).super___atomic_base<unsigned_int>._M_i - 1;
  UNLOCK();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_allocated_capacity != &local_88) {
    operator_delete((void *)local_98._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SimpleLogger::doCompression(size_t file_num) {
#if defined(__linux__) || defined(__APPLE__)
    std::string filename = getLogFilePath(file_num);
    std::string cmd;
    cmd = "tar zcvf " + filename + ".tar.gz " + filename;
    execCmd(cmd);

    cmd = "rm -f " + filename;
    execCmd(cmd);

    size_t max_log_files = maxLogFiles.load();
    // Remove previous log files.
    if (max_log_files && file_num >= max_log_files) {
        for (size_t ii=minRevnum; ii<=file_num-max_log_files; ++ii) {
            filename = getLogFilePath(ii);
            std::string filename_tar = getLogFilePath(ii) + ".tar.gz";
            cmd = "rm -f " + filename + " " + filename_tar;
            execCmd(cmd);
            minRevnum = ii+1;
        }
    }
#endif

    numCompJobs.fetch_sub(1);
}